

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.c
# Opt level: O3

Constraint * create_less_than_double_constraint(double expected_value,char *expected_value_name)

{
  Constraint *pCVar1;
  char *pcVar2;
  CgreenValue local_30;
  
  make_cgreen_double_value(&local_30,expected_value);
  pCVar1 = (Constraint *)malloc(0x80);
  pCVar1->parameter_name = (char *)0x0;
  pCVar1->failure_message = failure_message_for;
  pCVar1->actual_value_message = "\n\t\tactual value:\t\t\t[%ld]";
  (pCVar1->expected_value).type = local_30.type;
  *(undefined4 *)&(pCVar1->expected_value).field_0x4 = local_30._4_4_;
  (pCVar1->expected_value).value = local_30.value;
  (pCVar1->expected_value).value_size = local_30.value_size;
  pcVar2 = string_dup(expected_value_name);
  pCVar1->expected_value_name = pcVar2;
  pCVar1->type = CGREEN_DOUBLE_COMPARER_CONSTRAINT;
  pCVar1->compare = compare_want_lesser_double;
  pCVar1->execute = test_true;
  pCVar1->name = "be less than double";
  pCVar1->destroy = destroy_double_constraint;
  pCVar1->expected_value_message = "\t\texpected to be less than:\t[%08f]";
  return pCVar1;
}

Assistant:

Constraint *create_less_than_double_constraint(double expected_value, const char *expected_value_name) {
    Constraint *constraint = create_constraint_expecting(make_cgreen_double_value(expected_value), expected_value_name);
    constraint->type = CGREEN_DOUBLE_COMPARER_CONSTRAINT;

    constraint->compare = &compare_want_lesser_double;
    constraint->execute = &test_true;
    constraint->name = "be less than double";
    constraint->destroy = &destroy_double_constraint;
    constraint->expected_value_message = "\t\texpected to be less than:\t[%08f]";

    return constraint;
}